

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void discordpp::from_json(json *j,field<discordpp::Team> *f)

{
  state sVar1;
  undefined8 __p;
  undefined1 local_70 [96];
  
  if (j->m_type == null) {
    std::__uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>::reset
              ((__uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_> *)f,
               (pointer)0x0);
    sVar1 = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::Team,_0>(local_70 + 8,j);
    std::make_unique<discordpp::Team,discordpp::Team>((Team *)local_70);
    __p = local_70._0_8_;
    local_70._0_8_ = (__uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>)0x0;
    std::__uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>::reset
              ((__uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_> *)f,
               (pointer)__p);
    std::unique_ptr<discordpp::Team,_std::default_delete<discordpp::Team>_>::~unique_ptr
              ((unique_ptr<discordpp::Team,_std::default_delete<discordpp::Team>_> *)local_70);
    Team::~Team((Team *)(local_70 + 8));
    sVar1 = present_e;
  }
  f->s_ = sVar1;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }